

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O1

int match1by1(Abc_Ntk_t *pNtk1,Vec_Ptr_t **nodesInLevel1,Vec_Int_t **iMatch1,Vec_Int_t **iDep1,
             Vec_Int_t *matchedInputs1,int *iGroup1,Vec_Int_t **oMatch1,int *oGroup1,
             Abc_Ntk_t *pNtk2,Vec_Ptr_t **nodesInLevel2,Vec_Int_t **iMatch2,Vec_Int_t **iDep2,
             Vec_Int_t *matchedInputs2,int *iGroup2,Vec_Int_t **oMatch2,int *oGroup2,
             Vec_Int_t *matchedOutputs1,Vec_Int_t *matchedOutputs2,Vec_Int_t *oMatchedGroups,
             Vec_Int_t *iNonSingleton,int ii,int idx)

{
  size_t __size;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p;
  int *piVar6;
  Vec_Ptr_t *oMatchPairs;
  void **ppvVar7;
  void *__s;
  Abc_Ntk_t *pNtk2_00;
  Vec_Int_t *mismatch;
  Abc_Ntk_t *pNtk1_00;
  int *bitVector;
  Vec_Int_t *p_00;
  int *piVar8;
  Vec_Int_t *p_01;
  void *pvVar9;
  Vec_Int_t *pVVar10;
  Abc_Ntk_t *pAVar11;
  Vec_Ptr_t *pVVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  int i;
  int iVar21;
  int iVar22;
  Abc_Obj_t *local_68;
  ulong local_60;
  ulong local_58;
  int *local_50;
  Abc_Ntk_t *local_48;
  Abc_Ntk_t *local_40;
  Vec_Int_t *local_38;
  
  uVar19 = (ulong)(uint)ii;
  uVar18 = (ulong)(uint)idx;
  while( true ) {
    match1by1_MATCH_FOUND = 0;
    iVar5 = (int)uVar19;
    if (iVar5 == iNonSingleton->nSize) {
      match1by1_MATCH_FOUND = 1;
      return 1;
    }
    local_50 = iGroup1;
    if ((iVar5 < 0) || (iNonSingleton->nSize <= iVar5)) goto LAB_0029c133;
    iVar5 = iNonSingleton->pArray[uVar19];
    pVVar10 = iMatch1[iVar5];
    iVar17 = (int)uVar18;
    if (pVVar10->nSize != iVar17) break;
    uVar19 = uVar19 + 1;
    uVar18 = 0;
  }
  local_58 = uVar19;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 0x10;
  p->nSize = 0;
  piVar6 = (int *)malloc(0x40);
  p->pArray = piVar6;
  oMatchPairs = (Vec_Ptr_t *)malloc(0x10);
  oMatchPairs->nCap = 100;
  oMatchPairs->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  oMatchPairs->pArray = ppvVar7;
  iVar22 = pVVar10->nSize;
  __size = (long)iVar22 * 4;
  __s = malloc(__size);
  if (0 < (long)iVar22) {
    memset(__s,0,__size);
  }
  if ((iVar17 < 0) || (iVar22 <= iVar17)) {
LAB_0029c133:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  Vec_IntPush(matchedInputs1,pVVar10->pArray[uVar18]);
  if (iVar17 == 0) {
    pVVar10 = iMatch1[iVar5];
    uVar3 = pVVar10->nSize;
    if (0 < (int)uVar3) {
      lVar15 = 0;
      do {
        if (iDep1[pVVar10->pArray[(ulong)uVar3 - 1]]->nSize <= lVar15) goto LAB_0029b385;
        iVar22 = oGroup1[iDep1[pVVar10->pArray[(ulong)uVar3 - 1]]->pArray[lVar15]];
        if (oMatch1[iVar22]->nSize != 1) {
          if (0 < (long)oMatchedGroups->nSize) {
            lVar20 = 0;
            do {
              if (oMatchedGroups->pArray[lVar20] == iVar22) goto LAB_0029c0de;
              lVar20 = lVar20 + 1;
            } while (oMatchedGroups->nSize != lVar20);
          }
          if (0 < (long)p->nSize) {
            lVar20 = 0;
            do {
              if (p->pArray[lVar20] == iVar22) goto LAB_0029c075;
              lVar20 = lVar20 + 1;
            } while (p->nSize != lVar20);
          }
          Vec_IntPush(p,iVar22);
LAB_0029c075:
          lVar20 = (long)iMatch1[iVar5]->nSize;
          if (lVar20 < 1) break;
          if (iDep1[iMatch1[iVar5]->pArray[lVar20 + -1]]->nSize <= lVar15) goto LAB_0029c133;
          if (0 < (long)oMatchedGroups->nSize) {
            lVar14 = 0;
            do {
              if (oMatchedGroups->pArray[lVar14] ==
                  oGroup1[iDep1[iMatch1[iVar5]->pArray[lVar20 + -1]]->pArray[lVar15]])
              goto LAB_0029c0de;
              lVar14 = lVar14 + 1;
            } while (oMatchedGroups->nSize != lVar14);
          }
          Vec_IntPush(oMatchedGroups,
                      oGroup1[iDep1[iMatch1[iVar5]->pArray[lVar20 + -1]]->pArray[lVar15]]);
        }
LAB_0029c0de:
        lVar15 = lVar15 + 1;
        pVVar10 = iMatch1[iVar5];
        uVar3 = pVVar10->nSize;
      } while (0 < (int)uVar3);
    }
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
LAB_0029b385:
  pNtk2_00 = computeCofactor(pNtk1,nodesInLevel1,(int *)0x0,matchedInputs1);
  pVVar10 = iMatch2[iVar5];
  if (iVar17 < pVVar10->nSize && (match1by1_MATCH_FOUND & 1) == 0) {
    local_60 = (ulong)(iVar17 + 1);
    uVar19 = uVar18;
    local_38 = matchedInputs1;
    do {
      if (*(int *)((long)__s + uVar19 * 4) == 0) {
        mismatch = (Vec_Int_t *)malloc(0x10);
        mismatch->nCap = 0x10;
        mismatch->nSize = 0;
        piVar6 = (int *)malloc(0x40);
        mismatch->pArray = piVar6;
        iVar22 = (int)uVar19;
        if ((iVar22 < 0) || (pVVar10->nSize <= iVar22)) goto LAB_0029c133;
        Vec_IntPush(matchedInputs2,pVVar10->pArray[uVar19]);
        pNtk1_00 = computeCofactor(pNtk2,nodesInLevel2,(int *)0x0,matchedInputs2);
        if (0 < matchedOutputs1->nSize) {
          lVar15 = 0;
          do {
            iVar4 = matchedOutputs1->pArray[lVar15];
            if (((long)iVar4 < 0) || (pNtk2_00->vPos->nSize <= iVar4)) goto LAB_0029c114;
            pvVar9 = pNtk2_00->vPos->pArray[iVar4];
            uVar3 = oMatchPairs->nCap;
            if (oMatchPairs->nSize == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (oMatchPairs->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(oMatchPairs->pArray,0x80);
                }
                iVar4 = 0x10;
              }
              else {
                iVar4 = uVar3 * 2;
                if (iVar4 <= (int)uVar3) goto LAB_0029b52f;
                if (oMatchPairs->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar3 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(oMatchPairs->pArray,(ulong)uVar3 << 4);
                }
              }
              oMatchPairs->pArray = ppvVar7;
              oMatchPairs->nCap = iVar4;
            }
LAB_0029b52f:
            iVar4 = oMatchPairs->nSize;
            uVar3 = iVar4 + 1;
            oMatchPairs->nSize = uVar3;
            oMatchPairs->pArray[iVar4] = pvVar9;
            if (matchedOutputs2->nSize <= lVar15) goto LAB_0029c133;
            iVar4 = matchedOutputs2->pArray[lVar15];
            if (((long)iVar4 < 0) || (pNtk1_00->vPos->nSize <= iVar4)) {
LAB_0029c114:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar9 = pNtk1_00->vPos->pArray[iVar4];
            uVar13 = oMatchPairs->nCap;
            if (uVar3 == uVar13) {
              if ((int)uVar13 < 0x10) {
                if (oMatchPairs->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(oMatchPairs->pArray,0x80);
                }
                iVar4 = 0x10;
              }
              else {
                iVar4 = uVar13 * 2;
                if (iVar4 <= (int)uVar13) goto LAB_0029b5e2;
                if (oMatchPairs->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar13 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(oMatchPairs->pArray,(ulong)uVar13 << 4);
                }
              }
              oMatchPairs->pArray = ppvVar7;
              oMatchPairs->nCap = iVar4;
            }
LAB_0029b5e2:
            iVar4 = oMatchPairs->nSize;
            oMatchPairs->nSize = iVar4 + 1;
            oMatchPairs->pArray[iVar4] = pvVar9;
            lVar15 = lVar15 + 1;
          } while (lVar15 < matchedOutputs1->nSize);
        }
        match1by1::counter = match1by1::counter + 1;
        iVar4 = Abc_NtkBmSat(pNtk1_00,pNtk2_00,(Vec_Ptr_t *)0x0,oMatchPairs,mismatch,0);
        if (iVar4 == 0) {
          pVVar12 = pNtk1->vPis;
          piVar6 = (int *)malloc((long)pVVar12->nSize << 2);
          bitVector = (int *)malloc((long)pNtk2->vPis->nSize << 2);
          p_00 = (Vec_Int_t *)malloc(0x10);
          p_00->nCap = 0x10;
          p_00->nSize = 0;
          piVar8 = (int *)malloc(0x40);
          p_00->pArray = piVar8;
          p_01 = (Vec_Int_t *)malloc(0x10);
          p_01->nCap = 0x10;
          p_01->nSize = 0;
          piVar8 = (int *)malloc(0x40);
          p_01->pArray = piVar8;
          pVVar10 = iMatch2[iVar5];
          pvVar9 = malloc((long)(pVVar10->nSize - iVar17) << 2);
          if (0 < pVVar12->nSize) {
            lVar15 = 0;
            do {
              piVar6[lVar15] = 0;
              bitVector[lVar15] = 0;
              lVar15 = lVar15 + 1;
            } while (lVar15 < pVVar12->nSize);
          }
          iVar22 = pVVar10->nSize;
          uVar3 = iVar22 - iVar17;
          if (uVar3 != 0 && iVar17 <= iVar22) {
            memset(pvVar9,0,(ulong)uVar3 << 2);
          }
          iVar22 = mismatch->nSize;
          if (0 < (long)iVar22) {
            piVar8 = mismatch->pArray;
            uVar16 = 1;
            do {
              if ((ulong)(long)iVar22 <= uVar16) goto LAB_0029c133;
              uVar3 = piVar8[uVar16 - 1];
              if ((((int)uVar3 < 0) || (matchedInputs1->nSize <= (int)uVar3)) ||
                 (piVar6[matchedInputs1->pArray[uVar3]] = piVar8[uVar16],
                 matchedInputs2->nSize <= (int)uVar3)) goto LAB_0029c133;
              bitVector[matchedInputs2->pArray[uVar3]] = piVar8[uVar16];
              iVar4 = (int)uVar16;
              uVar16 = uVar16 + 2;
            } while (iVar4 + 1 < iVar22);
          }
          pVVar10 = iMatch1[iVar5];
          uVar16 = uVar18;
          if (iVar17 < pVVar10->nSize) {
            do {
              if (iVar17 < 0) goto LAB_0029c133;
              Vec_IntPush(p_00,pVVar10->pArray[uVar16]);
              if (iMatch2[iVar5]->nSize <= (int)uVar16) goto LAB_0029c133;
              Vec_IntPush(p_01,iMatch2[iVar5]->pArray[uVar16]);
              uVar16 = uVar16 + 1;
              pVVar10 = iMatch1[iVar5];
            } while ((int)uVar16 < pVVar10->nSize);
          }
          if (0 < pNtk1->vPis->nSize) {
            iVar22 = 0;
            do {
              if (0 < (long)matchedInputs1->nSize) {
                lVar15 = 0;
                do {
                  if (matchedInputs1->pArray[lVar15] == iVar22) goto LAB_0029b991;
                  lVar15 = lVar15 + 1;
                } while (matchedInputs1->nSize != lVar15);
              }
              if (0 < (long)p_00->nSize) {
                lVar15 = 0;
                do {
                  if (p_00->pArray[lVar15] == iVar22) goto LAB_0029b991;
                  lVar15 = lVar15 + 1;
                } while (p_00->nSize != lVar15);
              }
              Vec_IntPush(p_00,iVar22);
LAB_0029b991:
              if (0 < (long)matchedInputs2->nSize) {
                lVar15 = 0;
                do {
                  if (matchedInputs2->pArray[lVar15] == iVar22) goto LAB_0029b9ed;
                  lVar15 = lVar15 + 1;
                } while (matchedInputs2->nSize != lVar15);
              }
              if (0 < (long)p_01->nSize) {
                lVar15 = 0;
                do {
                  if (p_01->pArray[lVar15] == iVar22) goto LAB_0029b9ed;
                  lVar15 = lVar15 + 1;
                } while (p_01->nSize != lVar15);
              }
              Vec_IntPush(p_01,iVar22);
LAB_0029b9ed:
              iVar22 = iVar22 + 1;
            } while (iVar22 < pNtk1->vPis->nSize);
          }
          pAVar11 = computeCofactor(pNtk1,nodesInLevel1,piVar6,p_00);
          local_48 = computeCofactor(pNtk2,nodesInLevel2,bitVector,p_01);
          pVVar12 = pAVar11->vPos;
          local_40 = pAVar11;
          if (pVVar12->nSize < 1) {
            iVar22 = 0;
          }
          else {
            uVar16 = 0;
            iVar22 = 0;
            do {
              local_68 = (Abc_Obj_t *)pVVar12->pArray[uVar16];
              pVVar12 = Abc_NtkNodeSupport(local_40,&local_68,1);
              if (0 < (long)pVVar12->nSize) {
                lVar15 = 0;
                do {
                  if (*(int *)((long)pVVar12->pArray[lVar15] + 0x10) == 1) {
                    iVar4 = -1;
                    if (0 < (long)matchedOutputs1->nSize) {
                      lVar20 = 0;
                      do {
                        if (uVar16 == (uint)matchedOutputs1->pArray[lVar20]) {
                          iVar4 = (int)lVar20;
                          break;
                        }
                        lVar20 = lVar20 + 1;
                      } while (matchedOutputs1->nSize != lVar20);
                    }
                    iVar22 = iVar22 + iVar4 + 1;
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 != pVVar12->nSize);
              }
              if (pVVar12->pArray != (void **)0x0) {
                free(pVVar12->pArray);
                pVVar12->pArray = (void **)0x0;
              }
              if (pVVar12 != (Vec_Ptr_t *)0x0) {
                free(pVVar12);
              }
              uVar16 = uVar16 + 1;
              pVVar12 = local_40->vPos;
            } while ((long)uVar16 < (long)pVVar12->nSize);
          }
          pVVar12 = local_48->vPos;
          if (0 < pVVar12->nSize) {
            uVar16 = 0;
            do {
              local_68 = (Abc_Obj_t *)pVVar12->pArray[uVar16];
              pVVar12 = Abc_NtkNodeSupport(local_48,&local_68,1);
              iVar4 = pVVar12->nSize;
              if (0 < (long)iVar4) {
                ppvVar7 = pVVar12->pArray;
                iVar1 = iMatch2[iVar5]->nSize;
                lVar15 = 0;
                do {
                  iVar2 = *(int *)((long)ppvVar7[lVar15] + 0x10);
                  if ((0 < iVar2) && (iVar2 <= iVar1 - iVar17)) {
                    iVar21 = 0;
                    if (0 < (long)matchedOutputs2->nSize) {
                      lVar20 = 0;
                      do {
                        if (uVar16 == (uint)matchedOutputs2->pArray[lVar20]) {
                          iVar21 = (int)lVar20 + 1;
                          break;
                        }
                        lVar20 = lVar20 + 1;
                      } while (matchedOutputs2->nSize != lVar20);
                    }
                    piVar8 = (int *)((long)pvVar9 + (ulong)(iVar2 - 1) * 4);
                    *piVar8 = *piVar8 + iVar21;
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 != iVar4);
              }
              if (pVVar12->pArray != (void **)0x0) {
                free(pVVar12->pArray);
                pVVar12->pArray = (void **)0x0;
              }
              if (pVVar12 != (Vec_Ptr_t *)0x0) {
                free(pVVar12);
              }
              uVar16 = uVar16 + 1;
              pVVar12 = local_48->vPos;
            } while ((long)uVar16 < (long)pVVar12->nSize);
          }
          matchedInputs1 = local_38;
          pAVar11 = local_48;
          uVar3 = iMatch2[iVar5]->nSize - iVar17;
          if (uVar3 != 0 && iVar17 <= iMatch2[iVar5]->nSize) {
            uVar16 = 0;
            do {
              if (*(int *)((long)pvVar9 + uVar16 * 4) != iVar22) {
                *(undefined4 *)((long)__s + (long)(iVar17 + (int)uVar16) * 4) = 1;
              }
              uVar16 = uVar16 + 1;
            } while (uVar3 != uVar16);
          }
          Abc_NtkDelete(local_40);
          Abc_NtkDelete(pAVar11);
          if (piVar6 != (int *)0x0) {
            free(piVar6);
          }
          if (bitVector != (int *)0x0) {
            free(bitVector);
          }
          if (p_00->pArray != (int *)0x0) {
            free(p_00->pArray);
            p_00->pArray = (int *)0x0;
          }
          free(p_00);
          if (p_01->pArray != (int *)0x0) {
            free(p_01->pArray);
            p_01->pArray = (int *)0x0;
          }
          free(p_01);
          if (pvVar9 != (void *)0x0) {
            free(pvVar9);
          }
        }
        else if (uVar19 == uVar18) {
          matchNonSingletonOutputs
                    (pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,local_50,oMatch1,oGroup1,pNtk2
                     ,nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,
                     matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,pNtk2_00,pNtk1_00,
                     oMatchPairs,p,0,0,(int)local_58,(int)local_60);
        }
        else {
          pVVar10 = iMatch2[iVar5];
          if ((pVVar10->nSize <= iVar17) || (pVVar10->nSize <= iVar22)) goto LAB_0029c133;
          piVar6 = pVVar10->pArray;
          iVar4 = piVar6[uVar18];
          piVar6[uVar18] = piVar6[uVar19];
          if (pVVar10->nSize <= iVar22) {
LAB_0029c171:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar6[uVar19] = iVar4;
          matchNonSingletonOutputs
                    (pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,local_50,oMatch1,oGroup1,pNtk2
                     ,nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,
                     matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,pNtk2_00,pNtk1_00,
                     oMatchPairs,p,0,0,(int)local_58,(int)local_60);
          pVVar10 = iMatch2[iVar5];
          if ((pVVar10->nSize <= iVar17) || (pVVar10->nSize <= iVar22)) goto LAB_0029c133;
          piVar6 = pVVar10->pArray;
          iVar4 = piVar6[uVar18];
          piVar6[uVar18] = piVar6[uVar19];
          if (pVVar10->nSize <= iVar22) goto LAB_0029c171;
          piVar6[uVar19] = iVar4;
        }
        oMatchPairs->nSize = 0;
        Abc_NtkDelete(pNtk1_00);
        if (mismatch->pArray != (int *)0x0) {
          free(mismatch->pArray);
          mismatch->pArray = (int *)0x0;
        }
        free(mismatch);
        if (match1by1_MATCH_FOUND == 0) {
          if (matchedInputs2->nSize < 1) goto LAB_0029c152;
          matchedInputs2->nSize = matchedInputs2->nSize + -1;
        }
      }
      uVar19 = uVar19 + 1;
      pVVar10 = iMatch2[iVar5];
    } while (((int)uVar19 < pVVar10->nSize) && ((match1by1_MATCH_FOUND & 1) == 0));
  }
  if ((match1by1_MATCH_FOUND & 1) == 0) {
    if (matchedInputs1->nSize < 1) {
LAB_0029c152:
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
    }
    matchedInputs1->nSize = matchedInputs1->nSize + -1;
    if ((iVar17 == 0) && (iVar5 = p->nSize, 0 < iVar5)) {
      uVar3 = oMatchedGroups->nSize;
      uVar13 = (int)uVar3 >> 0x1f & uVar3;
      do {
        uVar3 = uVar3 - 1;
        if (uVar3 - uVar13 == -1) goto LAB_0029c152;
        oMatchedGroups->nSize = uVar3;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  if (oMatchPairs->pArray != (void **)0x0) {
    free(oMatchPairs->pArray);
    oMatchPairs->pArray = (void **)0x0;
  }
  free(oMatchPairs);
  if (__s != (void *)0x0) {
    free(__s);
  }
  Abc_NtkDelete(pNtk2_00);
  if ((match1by1_MATCH_FOUND == 1) && (match1by1::counter != 0)) {
    match1by1::counter = 0;
  }
  return (uint)match1by1_MATCH_FOUND;
}

Assistant:

int match1by1(Abc_Ntk_t * pNtk1, Vec_Ptr_t ** nodesInLevel1, Vec_Int_t ** iMatch1, Vec_Int_t ** iDep1, Vec_Int_t * matchedInputs1, int * iGroup1, Vec_Int_t ** oMatch1, int * oGroup1,
               Abc_Ntk_t * pNtk2, Vec_Ptr_t ** nodesInLevel2, Vec_Int_t ** iMatch2, Vec_Int_t ** iDep2, Vec_Int_t * matchedInputs2, int * iGroup2, Vec_Int_t ** oMatch2, int * oGroup2,
               Vec_Int_t * matchedOutputs1, Vec_Int_t * matchedOutputs2, Vec_Int_t * oMatchedGroups, Vec_Int_t * iNonSingleton, int ii, int idx)
{
    static int MATCH_FOUND = FALSE;
    Abc_Ntk_t * subNtk1, * subNtk2;
    Vec_Int_t * oNonSingleton;    
    Vec_Ptr_t * oMatchPairs;
    int * skipList;
    int j, m;    
    int i;        
    static int counter = 0;

    MATCH_FOUND = FALSE;

    if( ii == Vec_IntSize(iNonSingleton) )
    {
        MATCH_FOUND = TRUE;
        return TRUE;
    }
    
    i = Vec_IntEntry(iNonSingleton, ii);

    if( idx == Vec_IntSize(iMatch1[i]) )
    {        
        // call again with the next element in iNonSingleton
        return match1by1(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                         pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                         matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton, ii+1, 0);            
        
    }    
    
    oNonSingleton = Vec_IntAlloc(10);
    oMatchPairs = Vec_PtrAlloc(100);    
    skipList = ABC_ALLOC(int, Vec_IntSize(iMatch1[i]));

    for(j = 0; j < Vec_IntSize(iMatch1[i]); j++)
        skipList[j] = FALSE;
    
    Vec_IntPush(matchedInputs1, Vec_IntEntry(iMatch1[i], idx));
    idx++;
    
    if(idx == 1)
    {
        for(j = 0; j < Vec_IntSize(iDep1[Vec_IntEntryLast(iMatch1[i])]); j++)
        {
            if( Vec_IntSize(oMatch1[oGroup1[Vec_IntEntry(iDep1[Vec_IntEntryLast(iMatch1[i])], j)]]) == 1 ) 
                continue;
            if( Vec_IntFind( oMatchedGroups, oGroup1[Vec_IntEntry(iDep1[Vec_IntEntryLast(iMatch1[i])], j)]) != -1)
                continue;
            
            Vec_IntPushUnique(oNonSingleton,  oGroup1[Vec_IntEntry(iDep1[Vec_IntEntryLast(iMatch1[i])], j)]);
            Vec_IntPushUnique(oMatchedGroups, oGroup1[Vec_IntEntry(iDep1[Vec_IntEntryLast(iMatch1[i])], j)]);        
        }
    }

    subNtk1 = computeCofactor(pNtk1, nodesInLevel1, NULL, matchedInputs1);

    for(j = idx-1; j < Vec_IntSize(iMatch2[i]) && MATCH_FOUND == FALSE; j++)
    {
        int tempJ;
        Vec_Int_t * mismatch;

        if( skipList[j] )
            continue;

        mismatch = Vec_IntAlloc(10);

        Vec_IntPush(matchedInputs2, Vec_IntEntry(iMatch2[i], j));        
        
        subNtk2 = computeCofactor(pNtk2, nodesInLevel2, NULL, matchedInputs2);            

        for(m = 0; m < Vec_IntSize(matchedOutputs1); m++)
        {
            Vec_PtrPush(oMatchPairs, Abc_NtkPo(subNtk1, Vec_IntEntry(matchedOutputs1, m)));
            Vec_PtrPush(oMatchPairs, Abc_NtkPo(subNtk2, Vec_IntEntry(matchedOutputs2, m)));
        }

        counter++;

        if( Abc_NtkBmSat( subNtk2, subNtk1, NULL, oMatchPairs, mismatch, 0) )                
        {
            if(idx-1 != j)
            {
                tempJ = Vec_IntEntry(iMatch2[i], idx-1);
                Vec_IntWriteEntry(iMatch2[i], idx-1, Vec_IntEntry(iMatch2[i], j));
                Vec_IntWriteEntry(iMatch2[i], j, tempJ);
            }

            /*fprintf(matchFile, "%s matched to %s\n", Abc_ObjName(Abc_NtkPi(pNtk1, Vec_IntEntry(iMatch1[i], idx-1))), 
                                                      Abc_ObjName(Abc_NtkPi(pNtk2, Vec_IntEntry(iMatch2[i], j))));*/

            // we look for a match for outputs in oNonSingleton                                
            matchNonSingletonOutputs(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                                     pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                                     matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton,                         
                                     subNtk1, subNtk2, oMatchPairs, oNonSingleton, 0, 0, ii, idx);
            
            
            if(idx-1 != j)
            {
                tempJ = Vec_IntEntry(iMatch2[i], idx-1);
                Vec_IntWriteEntry(iMatch2[i], idx-1, Vec_IntEntry(iMatch2[i], j));
                Vec_IntWriteEntry(iMatch2[i], j, tempJ);
            }
        }
        else
        {
            Abc_Ntk_t * FpNtk1, * FpNtk2;
            int * bitVector1, * bitVector2;
            Vec_Int_t * currInputs1, * currInputs2;            
            Vec_Ptr_t * vSupp;    
            Abc_Obj_t * pObj;
            int suppNum1 = 0;
            int * suppNum2;            
            
            bitVector1 = ABC_ALLOC( int, Abc_NtkPiNum(pNtk1) );
            bitVector2 = ABC_ALLOC( int, Abc_NtkPiNum(pNtk2) );

            currInputs1 = Vec_IntAlloc(10);
            currInputs2 = Vec_IntAlloc(10);        
            
            suppNum2 = ABC_ALLOC(int, Vec_IntSize(iMatch2[i])-idx+1);

            for(m = 0; m < Abc_NtkPiNum(pNtk1); m++)
            {
                bitVector1[m] = 0;
                bitVector2[m] = 0;
            }

            for(m = 0; m < Vec_IntSize(iMatch2[i])-idx+1; m++)                        
                suppNum2[m]= 0;            

            // First of all set the value of the inputs that are already matched and are in mismatch
            for(m = 0; m < Vec_IntSize(mismatch); m += 2)
            {
                int n = Vec_IntEntry(mismatch, m);
                    
                bitVector1[Vec_IntEntry(matchedInputs1, n)] = Vec_IntEntry(mismatch, m+1);
                bitVector2[Vec_IntEntry(matchedInputs2, n)] = Vec_IntEntry(mismatch, m+1);
                
            }
            
            for(m = idx-1; m < Vec_IntSize(iMatch1[i]); m++)
            {
                Vec_IntPush(currInputs1, Vec_IntEntry(iMatch1[i], m));
                Vec_IntPush(currInputs2, Vec_IntEntry(iMatch2[i], m));
            }

            // Then add all the inputs that are not yet matched to the currInputs
            for(m = 0; m < Abc_NtkPiNum(pNtk1); m++)
            {
                if(Vec_IntFind( matchedInputs1, m ) == -1)
                    Vec_IntPushUnique(currInputs1, m);

                if(Vec_IntFind( matchedInputs2, m ) == -1)
                    Vec_IntPushUnique(currInputs2, m);
            }

            FpNtk1 = computeCofactor(pNtk1, nodesInLevel1, bitVector1, currInputs1);            
            FpNtk2 = computeCofactor(pNtk2, nodesInLevel2, bitVector2, currInputs2);    

            Abc_NtkForEachPo( FpNtk1, pObj, m )
            {        
                int n;
                vSupp  = Abc_NtkNodeSupport( FpNtk1, &pObj, 1 );                        
                
                for(n = 0; n < vSupp->nSize; n++)
                    if( Abc_ObjId((Abc_Obj_t *)vSupp->pArray[n]) == 1 )
                        suppNum1 += Vec_IntFind( matchedOutputs1, m) + 1;                
                        
                Vec_PtrFree( vSupp );
            }
            
            Abc_NtkForEachPo( FpNtk2, pObj, m )
            {        
                int n;
                vSupp  = Abc_NtkNodeSupport( FpNtk2, &pObj, 1 );                        
                
                for(n = 0; n < vSupp->nSize; n++)
                    if( (int)Abc_ObjId((Abc_Obj_t *)vSupp->pArray[n])-1 < (Vec_IntSize(iMatch2[i]))-idx+1 &&
                        (int)Abc_ObjId((Abc_Obj_t *)vSupp->pArray[n])-1 >= 0)
                        suppNum2[Abc_ObjId((Abc_Obj_t *)vSupp->pArray[n])-1] += Vec_IntFind( matchedOutputs2, m) + 1;                
                        
                Vec_PtrFree( vSupp );
            }

            /*if(suppNum1 != 0)            
                printf("Ntk1 is trigged");            

            if(suppNum2[0] != 0)
                printf("Ntk2 is trigged");*/

            for(m = 0; m < Vec_IntSize(iMatch2[i])-idx+1; m++)
                if(suppNum2[m] != suppNum1)
                {
                    skipList[m+idx-1] = TRUE;                    
                    /*printf("input is skipped");*/
                }
                
            Abc_NtkDelete( FpNtk1 );
            Abc_NtkDelete( FpNtk2 );
            ABC_FREE( bitVector1 );    
             ABC_FREE( bitVector2 );    
            Vec_IntFree( currInputs1 );
            Vec_IntFree( currInputs2 );            
            ABC_FREE( suppNum2 );
        }
        
        Vec_PtrClear(oMatchPairs);
        Abc_NtkDelete( subNtk2 );
        Vec_IntFree(mismatch);

        //Vec_IntWriteEntry(iMatch2[i], j, tempJ);        
        
        if( MATCH_FOUND == FALSE )
            Vec_IntPop(matchedInputs2);
    }

    if( MATCH_FOUND == FALSE )
    {
        Vec_IntPop(matchedInputs1);    
        
        if(idx == 1)
        {
            for(m = 0; m < Vec_IntSize(oNonSingleton); m++)
                Vec_IntPop( oMatchedGroups );
        }
    }
    
    Vec_IntFree( oNonSingleton );    
    Vec_PtrFree( oMatchPairs );    
    ABC_FREE( skipList );
    Abc_NtkDelete( subNtk1 );    

    if(MATCH_FOUND && counter != 0)
    {        
        /*printf("Number of INPUT SAT instances = %d\n", counter);*/

        counter = 0;
    }

    return MATCH_FOUND;
}